

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotation_t *
opengv::relative_pose::eigensolver
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices,
          eigensolverOutput_t *output,bool useWeights)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  eigensolverOutput_t *b;
  int iVar7;
  long lVar8;
  undefined7 in_register_00000081;
  int iVar9;
  size_t i;
  size_t sVar10;
  long lVar11;
  double dVar12;
  ResScalar RVar13;
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  double dVar15;
  Vector3d opticalFlow;
  bearingVector_t f2;
  bearingVector_t f2_1;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  bearingVector_t f1;
  Matrix3d xxF;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2b8;
  double local_2a8;
  undefined4 local_29c;
  double local_298;
  size_t local_290;
  undefined1 local_288 [24];
  scalar_constant_op<double> local_270;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_268;
  eigensolverOutput_t *local_250;
  rotation_t *local_248;
  undefined1 local_240 [24];
  Matrix<double,_3,_3,_0,_3,_3> local_228;
  Matrix<double,_3,_3,_0,_3,_3> local_1e0;
  Matrix<double,_3,_3,_0,_3,_3> local_198;
  Matrix<double,_3,_3,_0,_3,_3> local_150;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  Matrix<double,_3,_1,_0,_3,_1> local_c0 [3];
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  local_290 = indices->_numberCorrespondences;
  local_29c = (undefined4)CONCAT71(in_register_00000081,useWeights);
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_250 = output;
  local_248 = __return_storage_ptr__;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_108);
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_108,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_150);
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_150,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_198);
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_198,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_1e0);
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_1e0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_228);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_228,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_c0);
  auVar14 = ZEXT864(0) << 0x40;
  lVar11 = 0;
  for (sVar10 = 0; dVar12 = auVar14._0_8_, local_290 != sVar10; sVar10 = sVar10 + 1) {
    if (indices->_useIndices == false) {
      iVar9 = (int)sVar10;
    }
    else {
      iVar9 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar11 >> 0x1e));
    }
    dVar15 = dVar12;
    (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar9);
    lVar11 = lVar11 + 0x100000000;
    auVar14 = ZEXT864((ulong)(dVar12 + dVar15 * dVar15));
  }
  if (dVar12 < 0.0) {
    auVar14._0_8_ = sqrt(dVar12);
    auVar14._8_56_ = extraout_var;
  }
  else {
    auVar1 = vsqrtsd_avx(auVar14._0_16_,auVar14._0_16_);
    auVar14 = ZEXT1664(auVar1);
  }
  local_298 = auVar14._0_8_;
  lVar11 = 0;
  for (sVar10 = 0; b = local_250, dVar12 = auVar14._0_8_, local_290 != sVar10; sVar10 = sVar10 + 1)
  {
    iVar9 = (int)sVar10;
    lVar8 = lVar11 >> 0x1e;
    iVar7 = iVar9;
    if (indices->_useIndices != false) {
      iVar7 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar8);
    }
    (*adapter->_vptr_RelativeAdapterBase[2])(&local_2b8,adapter,(long)iVar7);
    iVar7 = iVar9;
    if (indices->_useIndices != false) {
      iVar7 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar8);
    }
    (*adapter->_vptr_RelativeAdapterBase[3])((LhsNested)local_240,adapter,(long)iVar7);
    local_288._0_8_ = (LhsNested)local_240;
    local_288._8_8_ = (LhsNested)local_240;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)local_288);
    dVar15 = 1.0;
    if ((char)local_29c != '\0') {
      if (indices->_useIndices != false) {
        iVar9 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar8);
      }
      (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar9);
      dVar15 = dVar12 / local_298;
    }
    local_288._0_8_ = &local_78;
    local_270.m_other = (double)local_2b8.m_lhs * dVar15 * (double)local_2b8.m_lhs;
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    local_288._0_8_ = &local_108;
    local_270.m_other = (double)local_2b8.m_rhs * (double)local_2b8.m_rhs * dVar15;
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    local_288._0_8_ = &local_150;
    local_270.m_other = local_2a8 * local_2a8 * dVar15;
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    local_288._0_8_ = &local_198;
    local_270.m_other = dVar15 * (double)local_2b8.m_lhs * (double)local_2b8.m_rhs;
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    local_288._0_8_ = &local_1e0;
    local_270.m_other = dVar15 * (double)local_2b8.m_rhs * local_2a8;
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    local_288._0_8_ = &local_228;
    local_270.m_other = dVar15 * local_2a8 * (double)local_2b8.m_lhs;
    auVar14 = ZEXT864((ulong)local_270.m_other);
    local_268 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_288._0_8_,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)local_288);
    lVar11 = lVar11 + 0x100000000;
  }
  modules::eigensolver_main
            (&local_78,&local_108,&local_150,&local_198,&local_1e0,&local_228,local_250);
  if (indices->_useIndices == true) {
    lVar11 = (long)*(indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  }
  else {
    lVar11 = 0;
  }
  (*adapter->_vptr_RelativeAdapterBase[2])(local_c0,adapter,lVar11);
  if (indices->_useIndices == true) {
    lVar11 = (long)*(indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  }
  else {
    lVar11 = 0;
  }
  (*adapter->_vptr_RelativeAdapterBase[3])
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_288,adapter,lVar11);
  local_2b8.m_lhs = &b->rotation;
  local_2b8.m_rhs = (RhsNested)local_288;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_288,&local_2b8);
  local_240._0_8_ = local_c0;
  local_240._8_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        *)local_288;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2b8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_240);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
           ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2b8,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)b);
  if (RVar13 < 0.0) {
    local_240._0_8_ = b;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&b->translation,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)local_240);
  }
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [8] = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  dVar12 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
  dVar15 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
  dVar2 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[3];
  dVar3 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4];
  dVar4 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5];
  dVar5 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[6];
  dVar6 = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[7];
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [0] = (b->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0];
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [1] = dVar12;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [2] = dVar15;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [3] = dVar2;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [4] = dVar3;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [5] = dVar4;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [6] = dVar5;
  (local_248->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [7] = dVar6;
  return local_248;
}

Assistant:

rotation_t eigensolver(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    eigensolverOutput_t & output,
    bool useWeights )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getBearingVector2(indices[i]);
    Eigen::Matrix3d F = f2*f2.transpose();
    
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
  }

  //Do minimization
  modules::eigensolver_main(xxF,yyF,zzF,xyF,yzF,zxF,output);

  //Correct the translation
  bearingVector_t f1 = adapter.getBearingVector1(indices[0]);
  bearingVector_t f2 = adapter.getBearingVector2(indices[0]);
  f2 = output.rotation * f2;
  Eigen::Vector3d opticalFlow = f1 - f2;
  if( opticalFlow.dot(output.translation) < 0.0 )
    output.translation = -output.translation;

  return output.rotation;
}